

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3PExpr(Parse *pParse,int op,Expr *pLeft,Expr *pRight,Token *pToken)

{
  Expr *local_38;
  Expr *p;
  Token *pToken_local;
  Expr *pRight_local;
  Expr *pLeft_local;
  int op_local;
  Parse *pParse_local;
  
  if (((op == 0x45) && (pLeft != (Expr *)0x0)) && (pRight != (Expr *)0x0)) {
    local_38 = sqlite3ExprAnd(pParse->db,pLeft,pRight);
  }
  else {
    local_38 = sqlite3ExprAlloc(pParse->db,op,pToken,1);
    sqlite3ExprAttachSubtrees(pParse->db,local_38,pLeft,pRight);
  }
  if (local_38 != (Expr *)0x0) {
    sqlite3ExprCheckHeight(pParse,local_38->nHeight);
  }
  return local_38;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3PExpr(
  Parse *pParse,          /* Parsing context */
  int op,                 /* Expression opcode */
  Expr *pLeft,            /* Left operand */
  Expr *pRight,           /* Right operand */
  const Token *pToken     /* Argument token */
){
  Expr *p;
  if( op==TK_AND && pLeft && pRight ){
    /* Take advantage of short-circuit false optimization for AND */
    p = sqlite3ExprAnd(pParse->db, pLeft, pRight);
  }else{
    p = sqlite3ExprAlloc(pParse->db, op, pToken, 1);
    sqlite3ExprAttachSubtrees(pParse->db, p, pLeft, pRight);
  }
  if( p ) {
    sqlite3ExprCheckHeight(pParse, p->nHeight);
  }
  return p;
}